

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void grid_cb(Fl_Int_Input *i,long v)

{
  Fl_Type *pFVar1;
  Fl_Window *this;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Type **ppFVar8;
  
  if (v - 1U < 3) {
    iVar3 = atoi((i->super_Fl_Input).super_Fl_Input_.value_);
    iVar7 = 0;
    if (0 < iVar3) {
      iVar7 = iVar3;
    }
    iVar3 = *(int *)(&DAT_0020c1f4 + (v - 1U) * 4);
    *(int *)(&PTR_typeinfo_002734b8)[v] = iVar7;
    Fl_Preferences::set(&fluid_prefs,&DAT_0020c1f4 + iVar3,iVar7);
  }
  ppFVar8 = &Fl_Type::first;
  while (pFVar1 = *ppFVar8, pFVar1 != (Fl_Type *)0x0) {
    iVar4 = (*pFVar1->_vptr_Fl_Type[0x21])(pFVar1);
    iVar3 = gridy;
    iVar7 = gridx;
    if (iVar4 != 0) {
      this = (Fl_Window *)pFVar1[1].prev;
      iVar5 = Fl::w();
      iVar6 = Fl::h();
      iVar2 = gridy;
      iVar4 = gridx;
      this->minw = iVar7;
      this->minh = iVar3;
      this->maxw = iVar5;
      this->maxh = iVar6;
      this->dw = iVar4;
      this->dh = iVar2;
      this->aspect = 0;
      Fl_Window::size_range_(this);
    }
    ppFVar8 = &pFVar1->next;
  }
  return;
}

Assistant:

void grid_cb(Fl_Int_Input *i, long v) {
  int n = atoi(i->value());
  if (n < 0) n = 0;
  switch (v) {
    case 1:
      gridx = n;
      fluid_prefs.set("gridx", n);
      break;
    case 2:
      gridy = n;
      fluid_prefs.set("gridy", n);
      break;
    case 3:
      snap = n;
      fluid_prefs.set("snap", n);
      break;
  }

  // Next go through all of the windows in the project and set the
  // stepping for resizes...
  Fl_Type *p;
  Fl_Window_Type *w;

  for (p = Fl_Type::first; p; p = p->next) {
    if (p->is_window()) {
      w = (Fl_Window_Type *)p;
      ((Fl_Window *)(w->o))->size_range(gridx, gridy,
                                        Fl::w(), Fl::h(),
                                        gridx, gridy, 0);
    }
  }
}